

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandSequence.cpp
# Opt level: O2

bool __thiscall CommandSequence::Validate(CommandSequence *this,ValidateState *state)

{
  pointer puVar1;
  CAssemblerCommand *pCVar2;
  int iVar3;
  byte bVar4;
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *cmd;
  pointer puVar5;
  
  puVar1 = (this->commands).
           super__Vector_base<std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>,_std::allocator<std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = 0;
  for (puVar5 = (this->commands).
                super__Vector_base<std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>,_std::allocator<std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    CAssemblerCommand::applyFileInfo
              ((puVar5->_M_t).
               super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>.
               _M_t.
               super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
               super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl);
    pCVar2 = (puVar5->_M_t).
             super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
             super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
             super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
    iVar3 = (*pCVar2->_vptr_CAssemblerCommand[2])(pCVar2,state);
    bVar4 = bVar4 | (byte)iVar3;
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool CommandSequence::Validate(const ValidateState &state)
{
	bool result = false;
	
	for (const std::unique_ptr<CAssemblerCommand>& cmd: commands)
	{
		cmd->applyFileInfo();
		if (cmd->Validate(state))
			result = true;
	}

	return result;
}